

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark-getaddrinfo.c
# Opt level: O0

int run_benchmark_getaddrinfo(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  int local_c;
  int i;
  
  loop = uv_default_loop();
  uv_update_time(loop);
  start_time = uv_now(loop);
  for (local_c = 0; local_c < 10; local_c = local_c + 1) {
    getaddrinfo_initiate(handles + local_c);
  }
  uv_run(loop,UV_RUN_DEFAULT);
  uv_update_time(loop);
  end_time = uv_now(loop);
  if (calls_initiated != 10000) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/benchmark-getaddrinfo.c"
            ,0x53,"calls_initiated == TOTAL_CALLS");
    abort();
  }
  if (calls_completed != 10000) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/benchmark-getaddrinfo.c"
            ,0x54,"calls_completed == TOTAL_CALLS");
    abort();
  }
  fprintf(_stderr,"getaddrinfo: %.0f req/s\n",(10000.0 / (double)(end_time - start_time)) * 1000.0);
  fflush(_stderr);
  puVar2 = uv_default_loop();
  close_loop(puVar2);
  puVar2 = uv_default_loop();
  iVar1 = uv_loop_close(puVar2);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/benchmark-getaddrinfo.c"
            ,0x5a,"0 == uv_loop_close(uv_default_loop())");
    abort();
  }
  uv_library_shutdown();
  return 0;
}

Assistant:

BENCHMARK_IMPL(getaddrinfo) {
  int i;

  loop = uv_default_loop();

  uv_update_time(loop);
  start_time = uv_now(loop);

  for (i = 0; i < CONCURRENT_CALLS; i++) {
    getaddrinfo_initiate(&handles[i]);
  }

  uv_run(loop, UV_RUN_DEFAULT);

  uv_update_time(loop);
  end_time = uv_now(loop);

  ASSERT(calls_initiated == TOTAL_CALLS);
  ASSERT(calls_completed == TOTAL_CALLS);

  fprintf(stderr, "getaddrinfo: %.0f req/s\n",
          (double) calls_completed / (double) (end_time - start_time) * 1000.0);
  fflush(stderr);

  MAKE_VALGRIND_HAPPY();
  return 0;
}